

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O1

HTTPAPI_RESULT
HTTPAPI_ExecuteRequest
          (HTTP_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE httpHeadersHandle,uchar *content,size_t contentLength,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHeadersHandle,BUFFER_HANDLE responseContent)

{
  bool bVar1;
  HTTP_HEADERS_RESULT HVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong index;
  HTTPAPI_RESULT HVar8;
  HTTPAPI_RESULT HVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  undefined8 uVar13;
  long local_70;
  char *tempBuffer;
  size_t sStack_60;
  char local_58;
  long httpCode;
  size_t local_48;
  ulong local_40;
  size_t headersCount;
  
  if ((httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0 ||
       (relativePath == (char *)0x0 || handle == (HTTP_HANDLE)0x0)) ||
     (contentLength != 0 && content == (uchar *)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    iVar3 = 0x204;
LAB_0010610d:
    HVar9 = HTTPAPI_INVALID_ARG;
    uVar13 = 2;
    pcVar7 = HTTPAPI_RESULTStringStorage[2];
LAB_0010611b:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",iVar3,1,"(result = %s%s (%d))","",pcVar7,uVar13);
    return HVar9;
  }
  HVar2 = HTTPHeaders_GetHeaderCount(httpHeadersHandle,&headersCount);
  if (HVar2 != HTTP_HEADERS_OK) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    iVar3 = 0x209;
    goto LAB_0010610d;
  }
  local_48 = contentLength;
  local_40 = (ulong)requestType;
  sVar5 = strlen(handle->hostURL);
  sVar6 = strlen(relativePath);
  lVar11 = sVar6 + sVar5;
  if (CARRY8(sVar6,sVar5)) {
    lVar11 = -1;
  }
  sVar5 = lVar11 + 1;
  if (sVar5 == 0) {
    sVar5 = 0xffffffffffffffff;
  }
  if (sVar5 == 0xffffffffffffffff) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_ExecuteRequest",0x212,1,"Invalid malloc size");
    }
  }
  else {
    pcVar7 = (char *)malloc(sVar5);
  }
  if (pcVar7 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_ERROR;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return HTTPAPI_ERROR;
    }
    iVar3 = 0x21d;
    uVar13 = 3;
    pcVar7 = HTTPAPI_RESULTStringStorage[3];
    goto LAB_0010611b;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x29,handle->verbose);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_VERBOSE (result = %s%s (%d))";
    iVar3 = 0x224;
    goto LAB_00106284;
  }
  iVar3 = strcpy_s(pcVar7,sVar5,handle->hostURL);
  if ((iVar3 != 0) || (iVar3 = strcat_s(pcVar7,sVar5,relativePath), iVar3 != 0)) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_STRING_PROCESSING_ERROR;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "(result = %s%s (%d))";
    iVar3 = 0x22a;
    uVar13 = 0xe;
    pcVar12 = HTTPAPI_RESULTStringStorage[0xe];
LAB_00106361:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",iVar3,1,pcVar10,"",pcVar12,uVar13);
    goto LAB_00106369;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x2712,pcVar7);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_URL (result = %s%s (%d))";
    iVar3 = 0x230;
LAB_00106284:
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    uVar13 = 5;
    pcVar12 = HTTPAPI_RESULTStringStorage[5];
    goto LAB_00106361;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x9b,handle->timeout);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_TIMEOUT_MS (result = %s%s (%d))";
    iVar3 = 0x235;
    goto LAB_00106284;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x13,handle->lowSpeedLimit);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_LOW_SPEED_LIMIT (result = %s%s (%d))";
    iVar3 = 0x23a;
    goto LAB_00106284;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x14,handle->lowSpeedTime);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_LOW_SPEED_TIME (result = %s%s (%d))";
    iVar3 = 0x23f;
    goto LAB_00106284;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x4a,handle->freshConnect);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_FRESH_CONNECT (result = %s%s (%d))";
    iVar3 = 0x244;
LAB_0010660b:
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",iVar3,1,pcVar10,"",HTTPAPI_RESULTStringStorage[5],5);
    goto LAB_00106369;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x4b,handle->forbidReuse);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_FORBID_REUSE (result = %s%s (%d))";
    iVar3 = 0x249;
    goto LAB_0010660b;
  }
  iVar3 = curl_easy_setopt(handle->curl,0x54,2);
  if (iVar3 != 0) {
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_SET_OPTION_FAILED;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106369;
    pcVar10 = "failed to set CURLOPT_HTTP_VERSION (result = %s%s (%d))";
    iVar3 = 0x24e;
    goto LAB_0010660b;
  }
  switch((int)local_40) {
  case 1:
    iVar3 = curl_easy_setopt(handle->curl,0x50,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2734,0);
      if (iVar3 == 0) {
LAB_00106bf4:
        HVar9 = HTTPAPI_OK;
        bVar1 = true;
        goto LAB_00106bfc;
      }
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x266;
        goto LAB_00106bd6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x25f;
LAB_00106bd6:
        HVar9 = HTTPAPI_SET_OPTION_FAILED;
        uVar13 = 5;
        pcVar10 = HTTPAPI_RESULTStringStorage[5];
        goto LAB_00106be4;
      }
    }
    break;
  case 2:
    iVar3 = curl_easy_setopt(handle->curl,0x2f,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2734,0);
      if (iVar3 == 0) goto LAB_00106bf4;
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x28a;
        goto LAB_00106bd6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x283;
        goto LAB_00106bd6;
      }
    }
    break;
  case 3:
    iVar3 = curl_easy_setopt(handle->curl,0x2f,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2734,"PUT");
      if (iVar3 == 0) goto LAB_00106bf4;
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x29b;
        goto LAB_00106bd6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x294;
        goto LAB_00106bd6;
      }
    }
    break;
  case 4:
    iVar3 = curl_easy_setopt(handle->curl,0x2f,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2734,"DELETE");
      if (iVar3 == 0) goto LAB_00106bf4;
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x2ab;
        goto LAB_00106bd6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x2a4;
        goto LAB_00106bd6;
      }
    }
    break;
  case 5:
    iVar3 = curl_easy_setopt(handle->curl,0x2f,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2734,"PATCH");
      if (iVar3 == 0) goto LAB_00106bf4;
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 699;
        goto LAB_00106bd6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x2b4;
        goto LAB_00106bd6;
      }
    }
    break;
  case 6:
    iVar3 = curl_easy_setopt(handle->curl,0x50,1);
    if (iVar3 == 0) {
      iVar3 = curl_easy_setopt(handle->curl,0x2c,1);
      if (iVar3 == 0) {
        iVar3 = curl_easy_setopt(handle->curl,0x2734,0);
        if (iVar3 == 0) goto LAB_00106bf4;
        p_Var4 = xlogging_get_log_function();
        HVar9 = HTTPAPI_SET_OPTION_FAILED;
        if (p_Var4 != (LOGGER_LOG)0x0) {
          iVar3 = 0x27a;
          goto LAB_00106bd6;
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        HVar9 = HTTPAPI_SET_OPTION_FAILED;
        if (p_Var4 != (LOGGER_LOG)0x0) {
          iVar3 = 0x275;
          goto LAB_00106bd6;
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x270;
        goto LAB_00106bd6;
      }
    }
    break;
  default:
    p_Var4 = xlogging_get_log_function();
    HVar9 = HTTPAPI_INVALID_ARG;
    if (p_Var4 == (LOGGER_LOG)0x0) break;
    iVar3 = 600;
    uVar13 = 2;
    pcVar10 = HTTPAPI_RESULTStringStorage[2];
LAB_00106be4:
    bVar1 = false;
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",iVar3,1,"(result = %s%s (%d))","",pcVar10,uVar13);
    goto LAB_00106bfc;
  }
  bVar1 = false;
LAB_00106bfc:
  if (!bVar1) goto LAB_00106369;
  if (headersCount == 0) {
    HVar9 = HTTPAPI_OK;
    local_70 = 0;
  }
  else {
    HVar9 = HTTPAPI_OK;
    local_70 = 0;
    index = 0;
    do {
      HVar2 = HTTPHeaders_GetHeader(httpHeadersHandle,index,&tempBuffer);
      if (HVar2 == HTTP_HEADERS_OK) {
        lVar11 = curl_slist_append(local_70,tempBuffer);
        if (lVar11 == 0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                      ,"HTTPAPI_ExecuteRequest",0x2d8,1,"(result = %s%s (%d))","",
                      HTTPAPI_RESULTStringStorage[0xf],0xf);
          }
          free(tempBuffer);
          HVar9 = HTTPAPI_ALLOC_FAILED;
LAB_00106d37:
          bVar1 = false;
        }
        else {
          free(tempBuffer);
          bVar1 = true;
          local_70 = lVar11;
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        HVar9 = HTTPAPI_HTTP_HEADERS_FAILED;
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106d37;
        bVar1 = false;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                  ,"HTTPAPI_ExecuteRequest",0x2cf,1,"(result = %s%s (%d))","",
                  HTTPAPI_RESULTStringStorage[0xd],0xd);
      }
    } while ((bVar1) && (index = index + 1, index < headersCount));
  }
  if (HVar9 == HTTPAPI_OK) {
    iVar3 = curl_easy_setopt(handle->curl,0x2727,local_70);
    if (iVar3 == 0) {
      if (content == (uchar *)0x0 || local_48 == 0) {
        HVar9 = HTTPAPI_OK;
        bVar1 = true;
        if (((int)local_40 != 1) &&
           ((iVar3 = curl_easy_setopt(handle->curl,0x271f,0), iVar3 != 0 ||
            (iVar3 = curl_easy_setopt(handle->curl,0x3c,0), iVar3 != 0)))) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            iVar3 = 0x300;
            goto LAB_00106edf;
          }
LAB_00106ef8:
          HVar9 = HTTPAPI_SET_OPTION_FAILED;
          bVar1 = false;
        }
      }
      else {
        iVar3 = curl_easy_setopt(handle->curl,0x271f,content);
        if ((iVar3 == 0) && (iVar3 = curl_easy_setopt(handle->curl,0x3c,local_48), iVar3 == 0)) {
          HVar9 = HTTPAPI_OK;
          bVar1 = true;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00106ef8;
          iVar3 = 0x2f5;
LAB_00106edf:
          bVar1 = false;
          HVar9 = HTTPAPI_SET_OPTION_FAILED;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                    ,"HTTPAPI_ExecuteRequest",iVar3,1,"(result = %s%s (%d))","",
                    HTTPAPI_RESULTStringStorage[5],5);
        }
      }
      if (bVar1) {
        iVar3 = curl_easy_setopt(handle->curl,0x272d,0);
        if (((iVar3 == 0) && (iVar3 = curl_easy_setopt(handle->curl,0x4e6f,0), iVar3 == 0)) &&
           (iVar3 = curl_easy_setopt(handle->curl,0x4e2b,ContentWriteFunction), iVar3 == 0)) {
          HVar9 = HTTPAPI_OK;
          bVar1 = true;
          if ((responseHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) &&
             ((iVar3 = curl_easy_setopt(handle->curl,0x272d), iVar3 != 0 ||
              (iVar3 = curl_easy_setopt(handle->curl,0x4e6f,HeadersWriteFunction), iVar3 != 0)))) {
            p_Var4 = xlogging_get_log_function();
            HVar9 = HTTPAPI_SET_OPTION_FAILED;
            if (p_Var4 == (LOGGER_LOG)0x0) {
              bVar1 = false;
            }
            else {
              bVar1 = false;
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                        ,"HTTPAPI_ExecuteRequest",0x31b,1,"(result = %s%s (%d))","",
                        HTTPAPI_RESULTStringStorage[5],5);
            }
          }
          if (bVar1) {
            tempBuffer = (char *)0x0;
            sStack_60 = 0;
            local_58 = '\0';
            iVar3 = curl_easy_setopt(handle->curl,0x2711);
            if (iVar3 == 0) {
              HVar9 = HTTPAPI_OK;
            }
            else {
              p_Var4 = xlogging_get_log_function();
              HVar9 = HTTPAPI_SET_OPTION_FAILED;
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                          ,"HTTPAPI_ExecuteRequest",0x328,1,"(result = %s%s (%d))","",
                          HTTPAPI_RESULTStringStorage[5],5);
              }
            }
            if (iVar3 == 0) {
              iVar3 = curl_easy_perform();
              if (iVar3 == 0) {
                iVar3 = curl_easy_getinfo(handle->curl,0x200002,&httpCode);
                if (iVar3 == 0) {
                  if (local_58 == '\0') {
                    if (statusCode != (uint *)0x0) {
                      *statusCode = (uint)httpCode;
                    }
                    HVar8 = HTTPAPI_OK;
                    if (sStack_60 != 0 && responseContent != (BUFFER_HANDLE)0x0) {
                      iVar3 = BUFFER_build(responseContent,(uchar *)tempBuffer,sStack_60);
                      HVar8 = HTTPAPI_OK;
                      if (iVar3 != 0) {
                        p_Var4 = xlogging_get_log_function();
                        HVar8 = HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                        if (p_Var4 != (LOGGER_LOG)0x0) {
                          (*p_Var4)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                                    ,"HTTPAPI_ExecuteRequest",0x351,1,"(result = %s%s (%d))","",
                                    HTTPAPI_RESULTStringStorage[0x11],0x11);
                        }
                      }
                    }
                    HVar9 = HTTPAPI_OK;
                    if (299 < CONCAT44(httpCode._4_4_,(uint)httpCode)) {
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_ExecuteRequest",0x35b,1,
                                  "Failure in HTTP communication: server reply code is %ld",
                                  CONCAT44(httpCode._4_4_,(uint)httpCode));
                      }
                      p_Var4 = xlogging_get_log_function();
                      HVar9 = HVar8;
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_INFO,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_ExecuteRequest",0x35d,1,"HTTP Response:%*.*s",
                                  sStack_60 & 0xffffffff,sStack_60 & 0xffffffff,tempBuffer);
                      }
                    }
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    HVar9 = HTTPAPI_READ_DATA_FAILED;
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      iVar3 = 0x342;
                      uVar13 = 10;
                      pcVar10 = HTTPAPI_RESULTStringStorage[10];
                      goto LAB_00107259;
                    }
                  }
                }
                else {
                  p_Var4 = xlogging_get_log_function();
                  HVar9 = HTTPAPI_QUERY_HEADERS_FAILED;
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    iVar3 = 0x33d;
                    uVar13 = 8;
                    pcVar10 = HTTPAPI_RESULTStringStorage[8];
                    goto LAB_00107259;
                  }
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  uVar13 = curl_easy_strerror();
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                            ,"HTTPAPI_ExecuteRequest",0x331,1,"curl_easy_perform() failed: %s\n",
                            uVar13);
                }
                p_Var4 = xlogging_get_log_function();
                HVar9 = HTTPAPI_OPEN_REQUEST_FAILED;
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  iVar3 = 0x333;
                  uVar13 = 4;
                  pcVar10 = HTTPAPI_RESULTStringStorage[4];
LAB_00107259:
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                            ,"HTTPAPI_ExecuteRequest",iVar3,1,"(result = %s%s (%d))","",pcVar10,
                            uVar13);
                }
              }
            }
            if (tempBuffer != (char *)0x0) {
              free(tempBuffer);
              tempBuffer = (char *)0x0;
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          HVar9 = HTTPAPI_SET_OPTION_FAILED;
          if (p_Var4 != (LOGGER_LOG)0x0) {
            iVar3 = 0x310;
            goto LAB_00106f8f;
          }
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      HVar9 = HTTPAPI_SET_OPTION_FAILED;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar3 = 0x2e9;
LAB_00106f8f:
        HVar9 = HTTPAPI_SET_OPTION_FAILED;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/httpapi_curl.c"
                  ,"HTTPAPI_ExecuteRequest",iVar3,1,"(result = %s%s (%d))","",
                  HTTPAPI_RESULTStringStorage[5],5);
      }
    }
  }
  curl_slist_free_all(local_70);
LAB_00106369:
  free(pcVar7);
  return HVar9;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_ExecuteRequest(HTTP_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
                                      HTTP_HEADERS_HANDLE httpHeadersHandle, const unsigned char* content,
                                      size_t contentLength, unsigned int* statusCode,
                                      HTTP_HEADERS_HANDLE responseHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPI_RESULT result;
    HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
    size_t headersCount;
    HTTP_RESPONSE_CONTENT_BUFFER responseContentBuffer;

    if ((httpHandleData == NULL) ||
        (relativePath == NULL) ||
        (httpHeadersHandle == NULL) ||
        ((content == NULL) && (contentLength > 0))
    )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else if (HTTPHeaders_GetHeaderCount(httpHeadersHandle, &headersCount) != HTTP_HEADERS_OK)
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else
    {
        char* tempHostURL;
        size_t tempHostURL_size = safe_add_size_t(strlen(httpHandleData->hostURL), strlen(relativePath));
        tempHostURL_size = safe_add_size_t(tempHostURL_size, 1);
        if (tempHostURL_size == SIZE_MAX)
        {
            LogError("Invalid malloc size");
            tempHostURL = NULL;
        }
        else
        {
            tempHostURL = malloc(tempHostURL_size);
        }

        if (tempHostURL == NULL)
        {
            result = HTTPAPI_ERROR;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
        }
        else
        {
            if (curl_easy_setopt(httpHandleData->curl, CURLOPT_VERBOSE, httpHandleData->verbose) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_VERBOSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if ((strcpy_s(tempHostURL, tempHostURL_size, httpHandleData->hostURL) != 0) ||
                (strcat_s(tempHostURL, tempHostURL_size, relativePath) != 0))
            {
                result = HTTPAPI_STRING_PROCESSING_ERROR;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            /* set the URL */
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_URL, tempHostURL) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_URL (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_TIMEOUT_MS, httpHandleData->timeout) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_TIMEOUT_MS (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_LIMIT, httpHandleData->lowSpeedLimit) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_LIMIT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_TIME, httpHandleData->lowSpeedTime) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_TIME (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FRESH_CONNECT, httpHandleData->freshConnect) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FRESH_CONNECT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FORBID_REUSE, httpHandleData->forbidReuse) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FORBID_REUSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_1) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_HTTP_VERSION (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                result = HTTPAPI_OK;

                switch (requestType)
                {
                default:
                    result = HTTPAPI_INVALID_ARG;
                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    break;

                case HTTPAPI_REQUEST_GET:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_HEAD:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_NOBODY, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }

                    break;

                case HTTPAPI_REQUEST_POST:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_PUT:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L))
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PUT") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_DELETE:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "DELETE") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_PATCH:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PATCH") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;
                }

                if (result == HTTPAPI_OK)
                {
                    /* add headers */
                    struct curl_slist* headers = NULL;
                    size_t i;

                    for (i = 0; i < headersCount; i++)
                    {
                        char *tempBuffer;
                        if (HTTPHeaders_GetHeader(httpHeadersHandle, i, &tempBuffer) != HTTP_HEADERS_OK)
                        {
                            /* error */
                            result = HTTPAPI_HTTP_HEADERS_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                            break;
                        }
                        else
                        {
                            struct curl_slist* newHeaders = curl_slist_append(headers, tempBuffer);
                            if (newHeaders == NULL)
                            {
                                result = HTTPAPI_ALLOC_FAILED;
                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                free(tempBuffer);
                                break;
                            }
                            else
                            {
                                free(tempBuffer);
                                headers = newHeaders;
                            }
                        }
                    }

                    if (result == HTTPAPI_OK)
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPHEADER, headers) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                        else
                        {
                            /* add content */
                            if ((content != NULL) &&
                                (contentLength > 0))
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)content) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, contentLength) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                            }
                            else
                            {
                                if (requestType != HTTPAPI_REQUEST_GET)
                                {
                                    if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)NULL) != CURLE_OK) ||
                                        (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, 0) != CURLE_OK))
                                    {
                                        result = HTTPAPI_SET_OPTION_FAILED;
                                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                    }
                                }
                                else
                                {
                                    /*GET request cannot POST, so "do nothing*/
                                }
                            }

                            if (result == HTTPAPI_OK)
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEFUNCTION, ContentWriteFunction) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                                else
                                {
                                    if (responseHeadersHandle != NULL)
                                    {
                                        /* setup the code to get the response headers */
                                        if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, responseHeadersHandle) != CURLE_OK) ||
                                            (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, HeadersWriteFunction) != CURLE_OK))
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }
                                    }

                                    if (result == HTTPAPI_OK)
                                    {
                                        responseContentBuffer.buffer = NULL;
                                        responseContentBuffer.bufferSize = 0;
                                        responseContentBuffer.error = 0;

                                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEDATA, &responseContentBuffer) != CURLE_OK)
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }

                                        if (result == HTTPAPI_OK)
                                        {
                                            /* Execute request */
                                            CURLcode curlRes = curl_easy_perform(httpHandleData->curl);
                                            if (curlRes != CURLE_OK)
                                            {
                                                LogError("curl_easy_perform() failed: %s\n", curl_easy_strerror(curlRes));
                                                result = HTTPAPI_OPEN_REQUEST_FAILED;
                                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                            }
                                            else
                                            {
                                                long httpCode;

                                                /* get the status code */
                                                if (curl_easy_getinfo(httpHandleData->curl, CURLINFO_RESPONSE_CODE, &httpCode) != CURLE_OK)
                                                {
                                                    result = HTTPAPI_QUERY_HEADERS_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else if (responseContentBuffer.error)
                                                {
                                                    result = HTTPAPI_READ_DATA_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else
                                                {
                                                    if (statusCode != NULL)
                                                    {
                                                        *statusCode = (unsigned int)httpCode;
                                                    }

                                                    /* fill response content length */
                                                    if (responseContent != NULL)
                                                    {
                                                        if ((responseContentBuffer.bufferSize > 0) && (BUFFER_build(responseContent, responseContentBuffer.buffer, responseContentBuffer.bufferSize) != 0))
                                                        {
                                                            result = HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                        }
                                                        else
                                                        {
                                                            /*all nice*/
                                                        }
                                                    }

                                                    if (httpCode >= 300)
                                                    {
                                                        LogError("Failure in HTTP communication: server reply code is %ld", httpCode);
                                                        LogInfo("HTTP Response:%*.*s", (int)responseContentBuffer.bufferSize,
                                                            (int)responseContentBuffer.bufferSize, responseContentBuffer.buffer);
                                                    }
                                                    else
                                                    {
                                                        result = HTTPAPI_OK;
                                                    }
                                                }
                                            }
                                        }

                                        if (responseContentBuffer.buffer != NULL)
                                        {
                                            free(responseContentBuffer.buffer);
                                            responseContentBuffer.buffer = NULL;
                                        }
                                    }
                                }
                            }
                        }
                    }
                    curl_slist_free_all(headers);
                }
            }
            free(tempHostURL);
        }
    }

    return result;
}